

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlWriter::XmlWriter(XmlWriter *this,ostream *os)

{
  ostream *os_local;
  XmlWriter *this_local;
  
  this->m_tagIsOpen = false;
  this->m_needsNewline = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&this->m_tags);
  std::__cxx11::string::string((string *)&this->m_indent);
  this->m_os = os;
  writeDeclaration(this);
  return;
}

Assistant:

XmlWriter::XmlWriter( std::ostream& os ) : m_os( os )
    {
        writeDeclaration();
    }